

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O2

Gia_Man_t * Gia_ManReadGig(char *pFileName)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *__ptr;
  char *pcVar5;
  Vec_Int_t *vObjs;
  Vec_Int_t *vStore;
  size_t sVar6;
  char *pcVar7;
  int Addition;
  char *pFileName_00;
  int iVar8;
  long lVar9;
  
  __ptr = Extra_FileReadContents(pFileName);
  if (__ptr == (char *)0x0) {
    printf("Cannot open input file %s\n",pFileName);
  }
  iVar8 = 0;
  for (pcVar5 = __ptr; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
    iVar8 = iVar8 + (uint)(*pcVar5 == '\n');
  }
  vObjs = Vec_IntAlloc(iVar8);
  vStore = Vec_IntAlloc(iVar8 * 10);
  pcVar5 = __ptr;
LAB_005789ff:
  do {
    do {
      pcVar5 = strtok(pcVar5," w(-,)]\r\t");
      if (pcVar5 == (char *)0x0) {
        free(__ptr);
        Gia_ManBuildGig(vObjs,vStore,pFileName_00);
        Vec_IntFree(vObjs);
        Vec_IntFree(vStore);
        return (Gia_Man_t *)0x0;
      }
      Vec_IntPush(vObjs,vStore->nSize);
      if (9 < (byte)(*pcVar5 - 0x30U)) {
        __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0xe6,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
      iVar8 = atoi(pcVar5);
      Vec_IntPush(vStore,iVar8);
      pcVar5 = strtok((char *)0x0," w(-,)]\r\t");
      if (*pcVar5 != '=') {
        __assert_fail("pToken[0] == \'=\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0xea,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
      pcVar5 = strtok((char *)0x0," w(-,)]\r\t");
      sVar6 = strlen(pcVar5);
      cVar1 = pcVar5[sVar6 - 1];
      if (cVar1 == '\n') {
        pcVar5[sVar6 - 1] = '\0';
      }
      lVar9 = 1;
      while( true ) {
        if (lVar9 == 10) {
          __assert_fail("Type < GIG_UNUSED",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0xf6,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        iVar8 = strcmp(pcVar5,s_GigNames[lVar9]);
        if (iVar8 == 0) break;
        lVar9 = lVar9 + 1;
      }
      iVar8 = (int)lVar9;
      Vec_IntPush(vStore,iVar8);
      pcVar5 = (char *)0x0;
    } while (cVar1 == '\n');
    iVar4 = vStore->nSize;
    Vec_IntPush(vStore,0);
    while( true ) {
      pcVar5 = strtok((char *)0x0," w(-,)]\r\t");
      if (pcVar5 == (char *)0x0) {
        __assert_fail("pToken != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x106,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
      cVar1 = *pcVar5;
      if (cVar1 == '\n') {
        pcVar5 = (char *)0x0;
        goto LAB_005789ff;
      }
      if (cVar1 == '[') break;
      if (9 < (byte)(cVar1 - 0x30U)) {
        __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x102,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
      iVar2 = atoi(pcVar5);
      Vec_IntPush(vStore,iVar2);
      Vec_IntAddToEntry(vStore,iVar4,Addition);
    }
    if (iVar8 == 6) {
      uVar3 = atoi(pcVar5 + 1);
    }
    else {
      if (iVar8 != 5) {
        __assert_fail("Type == GIG_DELAY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x117,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
      sVar6 = strlen(pcVar5 + 1);
      if (sVar6 != 4) {
        __assert_fail("strlen(pToken) == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x10e,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
      uVar3 = Abc_TtReadHexDigit(pcVar5[1]);
      iVar8 = Abc_TtReadHexDigit(pcVar5[2]);
      iVar4 = Abc_TtReadHexDigit(pcVar5[3]);
      iVar2 = Abc_TtReadHexDigit(pcVar5[4]);
      uVar3 = iVar2 << 0xc | iVar4 << 8 | iVar8 << 4 | uVar3;
    }
    Vec_IntPush(vStore,uVar3);
    pcVar7 = strtok((char *)0x0," w(-,)]\r\t");
    pcVar5 = (char *)0x0;
    if (*pcVar7 != '\n') {
      __assert_fail("pToken[0] == \'\\n\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                    ,0x11c,"Gia_Man_t *Gia_ManReadGig(char *)");
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManReadGig( char * pFileName )
{
    Gia_Man_t * pNew;
    int Type, Offset, fEndOfLine, Digit, nObjs; 
    char * pChars  = " w(-,)]\r\t";
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pStart  = pBuffer, * pToken;
    Vec_Int_t * vObjs, * vStore;
    if ( pBuffer == NULL )
        printf( "Cannot open input file %s\n", pFileName );
    // count objects
    for ( nObjs = 0, pToken = pBuffer; *pToken; pToken++ )
        nObjs += (int)(*pToken == '\n');
    // read objects
    vObjs  = Vec_IntAlloc( nObjs );
    vStore = Vec_IntAlloc( 10*nObjs );
    while ( 1 )
    {
        // read net ID
        pToken = strtok( pStart, pChars );
        pStart = NULL;
        if ( pToken == NULL )
            break;
        // start new object
        Vec_IntPush( vObjs, Vec_IntSize(vStore) );
        // save net ID
        assert( pToken[0] >= '0' && pToken[0] <= '9' );
        Vec_IntPush( vStore, atoi(pToken) );
        // read equal
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '=' );
        // read type
        pToken = strtok( pStart, pChars );
        fEndOfLine = 0;
        if ( pToken[strlen(pToken)-1] == '\n' )
        {
            pToken[strlen(pToken)-1] = 0;
            fEndOfLine = 1;
        }
        for ( Type = GIG_RESET; Type < GIG_UNUSED; Type++ )
            if ( !strcmp(pToken, s_GigNames[Type]) )
                break;
        assert( Type < GIG_UNUSED );
        Vec_IntPush( vStore, Type );
        if ( fEndOfLine )
            continue;
        // read fanins
        Offset = Vec_IntSize(vStore);
        Vec_IntPush( vStore, 0 );
        while ( 1 )
        {
            pToken = strtok( pStart, pChars );
            if ( pToken == NULL || pToken[0] == '\n' || pToken[0] == '[' )
                break;
            assert( pToken[0] >= '0' && pToken[0] <= '9' );
            Vec_IntPush( vStore, atoi(pToken) );
            Vec_IntAddToEntry( vStore, Offset, 1 );
        }
        assert( pToken != NULL );
        if ( pToken[0] == '\n' )
            continue;
        assert( pToken[0] == '[' );
        // read attribute
        pToken++;
        if ( Type == GIG_LUT )
        {
            assert( strlen(pToken) == 4 );
            Digit  = Abc_TtReadHexDigit(pToken[0]);
            Digit |= Abc_TtReadHexDigit(pToken[1]) << 4;
            Digit |= Abc_TtReadHexDigit(pToken[2]) << 8;
            Digit |= Abc_TtReadHexDigit(pToken[3]) << 12;
            Vec_IntPush( vStore, Digit );
        }
        else
        {
            assert( Type == GIG_DELAY );
            Vec_IntPush( vStore, atoi(pToken) );
        }
        // read end of line
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '\n' );
    }
    ABC_FREE( pBuffer );
    // create AIG
    pNew = Gia_ManBuildGig( vObjs, vStore, pFileName );
    // cleanup
    Vec_IntFree( vObjs );
    Vec_IntFree( vStore );
    return pNew;
}